

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti1_io.c
# Opt level: O0

char * nifti_datatype_to_string(int dtype)

{
  int local_14;
  int c;
  int tablen;
  int dtype_local;
  
  local_14 = 0x2a;
  while ((0 < local_14 && (nifti_type_list[local_14].type != dtype))) {
    local_14 = local_14 + -1;
  }
  return nifti_type_list[local_14].name;
}

Assistant:

const char * nifti_datatype_to_string( int dtype )
{
    int tablen = sizeof(nifti_type_list)/sizeof(nifti_type_ele);
    int c;

    for( c = tablen-1; c > 0; c-- )
        if( nifti_type_list[c].type == dtype )
            break;

    return nifti_type_list[c].name;
}